

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InternalCopyArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *newValue;
  undefined1 local_48 [4];
  uint32 n;
  ArrayElementEnumerator e;
  uint32 count;
  uint32 end_local;
  uint32 start_local;
  JavascriptArray *srcArray_local;
  uint32 dstIndex_local;
  JavascriptArray *dstArray_local;
  
  if ((end <= start) || ((srcArray->super_ArrayObject).length < end)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2c8a,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  e.end = 0;
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_48,srcArray,start,end);
  while( true ) {
    bVar2 = ArrayElementEnumerator::MoveNext<void*>((ArrayElementEnumerator *)local_48);
    if (!bVar2) break;
    uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_48);
    newValue = ArrayElementEnumerator::GetItem<void*>((ArrayElementEnumerator *)local_48);
    DirectSetItemAt<void*>(dstArray,dstIndex + (uVar3 - start),newValue);
    e.end = e.end + 1;
  }
  if (start + e.end != end) {
    InternalFillFromPrototype(dstArray,dstIndex,srcArray,start,end,e.end);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyArrayElements(JavascriptArray* dstArray, const uint32 dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<Var>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<Var>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }